

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu.c
# Opt level: O1

uint8_t mmu_read(gb_mmu_t *mmu,uint16_t addr)

{
  uint8_t uVar1;
  undefined6 in_register_00000032;
  
  if (mmu != (gb_mmu_t *)0x0) {
    uVar1 = (*(code *)(&DAT_00109860 + *(int *)(&DAT_00109860 + (ulong)(addr >> 0xc) * 4)))
                      (mmu->gb,addr,CONCAT62(in_register_00000032,addr) & 0xffffffff,mmu,
                       &DAT_00109860 + *(int *)(&DAT_00109860 + (ulong)(addr >> 0xc) * 4));
    return uVar1;
  }
  __assert_fail("mmu != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/loochek[P]gameboy/src/core/mmu.c"
                ,0x5a,"uint8_t mmu_read(gb_mmu_t *, uint16_t)");
}

Assistant:

uint8_t mmu_read(gb_mmu_t *mmu, uint16_t addr)
{
    assert(mmu != NULL);

    gb_t *gb = mmu->gb;

    switch (addr & 0xF000)
    {
    case 0x0000:
    case 0x1000:
    case 0x2000:
    case 0x3000:
    case 0x4000:
    case 0x5000:
    case 0x6000:
    case 0x7000:
    case 0xA000:
    case 0xB000:
        if (addr < 0x100 && mmu->bootrom_mapped)
            return gb_bootrom[addr];
        else
        {
            // ROM and external RAM requests are redirected to the cartridge
            if (mmu->cart == NULL)
                return 0xFF;
            else
                return cart_read(mmu->cart, addr);
        }

    case 0x8000:
    case 0x9000:
        // VRAM
        return ppu_vram_read(&gb->ppu, addr);

    case 0xC000:
    case 0xD000:
        // Internal RAM
        return mmu->ram[addr - 0xC000];
    
    case 0xE000:
        // unused
        return 0xFF;

    case 0xF000:
        switch (addr & 0xF00)
        {
        case 0x000:
        case 0x100:
        case 0x200:
        case 0x300:
        case 0x400:
        case 0x500:
        case 0x600:
        case 0x700:
        case 0x800:
        case 0x900:
        case 0xA00:
        case 0xB00:
        case 0xC00:
        case 0xD00:
            // unused
            return 0xFF;
        
        case 0xE00:
            if (addr >= 0xFEA0)
            {
                // unused
                return 0xFF;
            }
            
            // OAM
            return ppu_oam_read(&gb->ppu, addr);

        case 0xF00:
            switch (addr & 0xFF)
            {
            case 0x0F:
                // IF (interrupt controller)
                return int_if_read(&gb->intr_ctrl);

            case 0xFF:
                // IE (interrupt controller)
                return int_ie_read(&gb->intr_ctrl);

            case 0x00:
                // JOYP (Joypad)
                return joypad_joyp_read(&gb->joypad);

            case 0x04:
                // DIV (timer)
                return timer_div_read(&gb->timer);

            case 0x05:
                // TIMA (timer)
                return timer_tima_read(&gb->timer);

            case 0x06:
                // TMA (timer)
                return timer_tma_read(&gb->timer);

            case 0x07:
                // TAC (timer)
                return timer_tac_read(&gb->timer);

            case 0x40:
                // LCDC (PPU)
                return ppu_lcdc_read(&gb->ppu);

            case 0x41:
                // STAT (PPU)
                return ppu_stat_read(&gb->ppu);

            case 0x42:
                // SCY (PPU)
                return ppu_scy_read(&gb->ppu);
            case 0x43:
                // SCX (PPU)
                return ppu_scx_read(&gb->ppu);

            case 0x44:
                // LY (PPU)
                return ppu_ly_read(&gb->ppu);

            case 0x45:
                // LYC (PPU)
                return ppu_lyc_read(&gb->ppu);

            case 0x47:
                // BGP (PPU)
                return ppu_bgp_read(&gb->ppu);

            case 0x48:
                // OBP0 (PPU)
                return ppu_obp0_read(&gb->ppu);

            case 0x49:
                // OBP1 (PPU)
                return ppu_obp1_read(&gb->ppu);

            case 0x4A:
                // WY (PPU)
                return ppu_wy_read(&gb->ppu);

            case 0x4B:
                // WX (PPU)
                return ppu_wx_read(&gb->ppu);

            case 0x46:
                // DMA (PPU)
                return ppu_dma_read(&gb->ppu);

            default:
                if (addr >= 0xFF80 && addr < 0xFFFF)
                    return mmu->hram[addr - 0xFF80];
                else
                    return 0xFF;
            }

        default:
            return 0xFF;
        }
    
    default:
        return 0xFF;
    }
}